

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Messages.hpp
# Opt level: O0

void __thiscall
webfront::msg::FunctionCall::
encodeParameter<char_const(&)[12],webfront::websocket::Frame<webfront::networking::TCPNetworkingTS>>
          (FunctionCall *this,char (*t) [12],Frame<webfront::networking::TCPNetworkingTS> *frame)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  uint8_t uVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  ostream *poVar3;
  size_t sVar4;
  size_t in_RDX;
  char *in_RSI;
  FunctionCall *in_RDI;
  anon_class_24_3_42224fb6 encodeString;
  anon_class_8_1_8991fb9c encodeType;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffffa0;
  FunctionCall *in_stack_ffffffffffffffc8;
  
  uVar1 = getParametersCount(in_RDI);
  setParametersCount(in_RDI,uVar1 + '\x01');
  std::operator<<((ostream *)&std::cout,"Param: ");
  typeName<char_const(&)[12]>(in_stack_ffffffffffffffc8);
  __str._M_str = in_stack_ffffffffffffffa0;
  __str._M_len = (size_t)in_RDI;
  pbVar2 = std::operator<<(in_stack_ffffffffffffff90,__str);
  poVar3 = std::operator<<(pbVar2," -> ");
  typeName<char[12]>(in_stack_ffffffffffffffc8);
  __str_00._M_str = in_stack_ffffffffffffffa0;
  __str_00._M_len = (size_t)in_RDI;
  pbVar2 = std::operator<<(poVar3,__str_00);
  poVar3 = std::operator<<(pbVar2," : ");
  poVar3 = std::operator<<(poVar3,in_RSI);
  std::operator<<(poVar3,"\n");
  encodeParameter<const_char_(&)[12],_webfront::websocket::Frame<webfront::networking::TCPNetworkingTS>_>
  ::anon_class_24_3_42224fb6::operator()((anon_class_24_3_42224fb6 *)in_RDI,(char *)in_RDI,in_RDX);
  poVar3 = std::operator<<((ostream *)&std::cout,"bufferIndex = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI->encodeBufferIndex);
  poVar3 = std::operator<<(poVar3," ,payloadSize = ");
  sVar4 = getPayloadSize(in_RDI);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
  std::operator<<(poVar3,"\n");
  return;
}

Assistant:

void encodeParameter(T&& t, WebSocketFrame& frame) {
        using namespace std;
        using ParamType = remove_cvref_t<T>;
        setParametersCount(getParametersCount() + 1);

        if constexpr (is_printable<T>::value) {
            std::cout << "Param: " << typeName<T>() << " -> " << typeName<ParamType>() << " : " << t << "\n";
        }

        [[maybe_unused]] auto encodeType = [&, this](msg::CodedType type, auto size, WebSocketFrame& wsFrame) {
            wsFrame.addBuffer(std::span(&buffer[encodeBufferIndex], 1 + sizeof(size)));
            buffer[encodeBufferIndex++] = static_cast<std::byte>(type);
            std::copy_n(reinterpret_cast<const std::byte*>(&size), sizeof(size), &buffer[encodeBufferIndex]);
            encodeBufferIndex += sizeof(size);
            incrementPayloadSize(1 + sizeof(size));
        };

        [[maybe_unused]] auto encodeString = [&](const char* str, size_t size) constexpr {
            if (size < 256)
                encodeType(msg::CodedType::smallString, static_cast<uint8_t>(size), frame);
            else
                encodeType(msg::CodedType::string, static_cast<uint16_t>(size), frame);
            frame.addBuffer(span(reinterpret_cast<const std::byte*>(str), size));
            incrementPayloadSize(size);

            std::cout << "-> encoded to string of size " << size << " in a span.\n";
        };

        if constexpr (is_tuple_v<ParamType>) {
            uint8_t nbParams = static_cast<uint8_t>(tuple_size<ParamType>::value);
            encodeType(msg::CodedType::tuple, nbParams, frame);
            std::apply([&](auto&... tupleArgs) { ((encodeParameter(tupleArgs, frame)), ...); }, t);
        }
        else if constexpr (is_same_v<ParamType, bool>) {
            frame.addBuffer(span(&buffer[encodeBufferIndex], 1));
            buffer[encodeBufferIndex++] = static_cast<byte>(t ? msg::CodedType::booleanTrue : msg::CodedType::booleanFalse);
            incrementPayloadSize(1);
            std::cout << "-> encoded to bool of size " << 1 << " in a span.";
        }
        else if constexpr (is_arithmetic_v<ParamType>) {
            double number = t;
            frame.addBuffer(span(&buffer[encodeBufferIndex], 1 + sizeof(number)));
            buffer[encodeBufferIndex++] = static_cast<byte>(msg::CodedType::number);
            copy_n(reinterpret_cast<const byte*>(&number), sizeof(number), &buffer[encodeBufferIndex]);
            encodeBufferIndex += sizeof(number);
            incrementPayloadSize(1 + sizeof(number));
            std::cout << "-> encoded to number of size " << sizeof(number) << " in a span.";
        }

        else if constexpr (is_array_v<ParamType>) {
            using ElementType = remove_all_extents_t<ParamType>;
            //   cout << "Array of " << typeName<ElementType>() << "\n";
            //   cout << typeName<ParamType>() << " is bounded : " << is_bounded_array_v<ParamType> << "\n";
            if constexpr (is_same_v<ElementType, char>) {
                if constexpr (is_bounded_array_v<ParamType>)
                    encodeString(t, extent_v<ParamType> - 1);
                else
                    encodeString(t, char_traits<char>::length(t));
            }
            else
                static_assert(is_same_v<ElementType, char>, "Arrays are not supported by JSFunction");
        }
        else if constexpr (is_same_v<ParamType, const char*>)
            encodeString(t, char_traits<char>::length(t));

        else if constexpr (is_same_v<ParamType, string> or is_same_v<ParamType, string_view>)
            encodeString(t.data(), t.size());

        else if constexpr (is_pointer_v<ParamType>)
            static_assert(!is_pointer_v<ParamType>, "Pointers cannot be used by JSFunction");

        else if constexpr (is_base_of_v<std::exception, ParamType>) {
            std::cout << "Exception : " << t.what() << '\n';
            auto textSize = char_traits<char>::length(t.what());
            encodeType(msg::CodedType::exception, static_cast<uint16_t>(textSize), frame);
            frame.addBuffer(span(reinterpret_cast<const std::byte*>(t.what()), textSize));
            incrementPayloadSize(textSize);
        }

        std::cout << "bufferIndex = " << encodeBufferIndex << " ,payloadSize = " << getPayloadSize() << "\n";
    }